

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertSignedBytesEqual
          (UtestShell *this,char expected,char actual,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString local_a8;
  TestFailure local_98;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  if (expected != actual) {
    SimpleString::SimpleString(&local_a8,text);
    SignedBytesEqualFailure::SignedBytesEqualFailure
              ((SignedBytesEqualFailure *)&local_98,this,fileName,lineNumber,expected,actual,
               &local_a8);
    (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
  }
  return;
}

Assistant:

void UtestShell::assertSignedBytesEqual(signed char expected, signed char actual, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(SignedBytesEqualFailure (this, fileName, lineNumber, expected, actual, text), testTerminator);
}